

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

word If_Dec6DeriveNonDisjoint(word t,int s,int *Pla2Var0,int *Var2Pla0)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  word t_00;
  word t_01;
  int aiStack_98 [2];
  int Var2Pla [6];
  uint auStack_78 [2];
  int Pla2Var [6];
  int i;
  int Truth1;
  int Truth0;
  int Cof1 [2];
  int Cof0 [2];
  word c1;
  word c0;
  word z;
  int *Var2Pla0_local;
  int *Pla2Var0_local;
  word wStack_10;
  int s_local;
  word t_local;
  
  if ((s < 2) || (5 < s)) {
    __assert_fail("s >= 2 && s <= 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                  ,0x15a,"word If_Dec6DeriveNonDisjoint(word, int, int *, int *)");
  }
  for (Pla2Var[5] = 0; iVar2 = s, wStack_10 = t, Pla2Var[5] < 6; Pla2Var[5] = Pla2Var[5] + 1) {
    auStack_78[Pla2Var[5]] = Pla2Var0[Pla2Var[5]];
    aiStack_98[Pla2Var[5]] = Var2Pla0[Pla2Var[5]];
  }
  while (Pla2Var[5] = iVar2, Pla2Var[5] < 5) {
    wStack_10 = If_Dec6SwapAdjacent(wStack_10,Pla2Var[5]);
    aiStack_98[(int)auStack_78[Pla2Var[5]]] = aiStack_98[(int)auStack_78[Pla2Var[5]]] + 1;
    aiStack_98[(int)auStack_78[Pla2Var[5] + 1]] = aiStack_98[(int)auStack_78[Pla2Var[5] + 1]] + -1;
    auStack_78[Pla2Var[5]] = auStack_78[Pla2Var[5] + 1] ^ auStack_78[Pla2Var[5]];
    auStack_78[Pla2Var[5] + 1] = auStack_78[Pla2Var[5]] ^ auStack_78[Pla2Var[5] + 1];
    auStack_78[Pla2Var[5]] = auStack_78[Pla2Var[5] + 1] ^ auStack_78[Pla2Var[5]];
    iVar2 = Pla2Var[5] + 1;
  }
  t_00 = If_Dec6Cofactor(wStack_10,5,0);
  t_01 = If_Dec6Cofactor(wStack_10,5,1);
  iVar2 = If_Dec6CofCount2(t_00);
  if (2 < iVar2) {
    __assert_fail("2 >= If_Dec6CofCount2(c0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                  ,0x16b,"word If_Dec6DeriveNonDisjoint(word, int, int *, int *)");
  }
  iVar2 = If_Dec6CofCount2(t_01);
  if (2 < iVar2) {
    __assert_fail("2 >= If_Dec6CofCount2(c1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                  ,0x16c,"word If_Dec6DeriveNonDisjoint(word, int, int *, int *)");
  }
  uVar3 = If_Dec6DeriveCount2(t_00,Cof1,Cof1 + 1);
  uVar4 = If_Dec6DeriveCount2(t_01,&Truth1,&Truth0);
  c0 = (word)(int)((uVar4 & 0xff) << 8 | uVar3 & 0xff);
  for (Pla2Var[5] = 0; Pla2Var[5] < 4; Pla2Var[5] = Pla2Var[5] + 1) {
    c0 = (long)(int)auStack_78[Pla2Var[5] + 2] << ((char)(Pla2Var[5] << 2) + 0x10U & 0x3f) | c0;
  }
  c0 = (long)(Truth0 << 4 | Truth1) << 0x28 | (long)(Cof1[1] << 4 | Cof1[0]) << 0x20 | c0;
  for (Pla2Var[5] = 0; Pla2Var[5] < 2; Pla2Var[5] = Pla2Var[5] + 1) {
    c0 = (long)(int)auStack_78[Pla2Var[5]] << ((char)(Pla2Var[5] << 2) + 0x30U & 0x3f) | c0;
  }
  cVar1 = (char)Pla2Var[5];
  iVar2 = Pla2Var[5] << 2;
  Pla2Var[5] = Pla2Var[5] + 2;
  if (Pla2Var[5] != 4) {
    __assert_fail("i == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                  ,0x178,"word If_Dec6DeriveNonDisjoint(word, int, int *, int *)");
  }
  return (long)Pla2Var[3] << ((cVar1 + '\x01') * '\x04' + 0x30U & 0x3f) |
         7L << ((char)iVar2 + 0x30U & 0x3f) | c0;
}

Assistant:

static word If_Dec6DeriveNonDisjoint( word t, int s, int Pla2Var0[6], int Var2Pla0[6] )
{
    word z, c0, c1;
    int Cof0[2], Cof1[2];
    int Truth0, Truth1, i;
    int Pla2Var[6], Var2Pla[6];
    assert( s >= 2 && s <= 5 );
    for ( i = 0; i < 6; i++ )
    {
        Pla2Var[i] = Pla2Var0[i];
        Var2Pla[i] = Var2Pla0[i];
    }
    for ( i = s; i < 5; i++ )
    {
        t = If_Dec6SwapAdjacent( t, i );
        Var2Pla[Pla2Var[i]]++;
        Var2Pla[Pla2Var[i+1]]--;
        Pla2Var[i] ^= Pla2Var[i+1];
        Pla2Var[i+1] ^= Pla2Var[i];
        Pla2Var[i] ^= Pla2Var[i+1];
    }
    c0 = If_Dec6Cofactor( t, 5, 0 );
    c1 = If_Dec6Cofactor( t, 5, 1 );
    assert( 2 >= If_Dec6CofCount2(c0) );
    assert( 2 >= If_Dec6CofCount2(c1) );
    Truth0 = If_Dec6DeriveCount2( c0, &Cof0[0], &Cof0[1] );
    Truth1 = If_Dec6DeriveCount2( c1, &Cof1[0], &Cof1[1] );
    z = ((Truth1 & 0xFF) << 8) | (Truth0 & 0xFF);
    for ( i = 0; i < 4; i++ )
        z |= (((word)Pla2Var[i+2]) << (16 + 4*i));
    z |= ((word)((Cof0[1] << 4) | Cof0[0]) << 32);
    z |= ((word)((Cof1[1] << 4) | Cof1[0]) << 40);
    for ( i = 0; i < 2; i++ )
        z |= (((word)Pla2Var[i]) << (48 + 4*i));
    z |= (((word)7) << (48 + 4*i++));
    z |= (((word)Pla2Var[5]) << (48 + 4*i++));
    assert( i == 4 );
    return z;
}